

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O2

bool Remove(Vector *V,int i)

{
  int iVar1;
  ostream *poVar2;
  long lVar3;
  char *pcVar4;
  
  iVar1 = V->VectorLength;
  if (iVar1 == 0) {
    pcVar4 = "Vector is empty!";
  }
  else {
    if (i < iVar1 && -1 < i) {
      for (lVar3 = 1; lVar3 < iVar1 + -1; lVar3 = lVar3 + 1) {
        V->elements[lVar3] = V->elements[lVar3 + 1];
        iVar1 = V->VectorLength;
      }
      V->VectorLength = iVar1 + -1;
      return true;
    }
    pcVar4 = "position error!";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar2);
  return false;
}

Assistant:

bool Remove(Vector *V,int i)  //删除向量的第i个表目
{
    if(V->VectorLength == 0)  //空向量
    {
        cout << "Vector is empty!" << endl;
        return false;
    }
    else if(i<0||i>V->VectorLength-1)  //删除位置错误
    {
        cout << "position error!" << endl;
        return false;
    }
    else {
        int j;
        for (j = 1; j < V->VectorLength - 1; j++)  //前移
            V->elements[j] = V->elements[j+1];
        V->VectorLength--;   //向量长度减1
        return true;
    }
}